

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O3

void __thiscall spdlog::spdlog_ex::spdlog_ex(spdlog_ex *this,string *msg,int last_errno)

{
  memory_buf_t outbuf;
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  buffer<char> local_150;
  char local_130 [256];
  
  *(undefined ***)this = &PTR__spdlog_ex_00159b28;
  (this->msg_)._M_dataplus._M_p = (pointer)&(this->msg_).field_2;
  (this->msg_)._M_string_length = 0;
  (this->msg_).field_2._M_local_buf[0] = '\0';
  local_150.size_ = 0;
  local_150._vptr_buffer = (_func_int **)&PTR_grow_00159480;
  local_150.capacity_ = 0xfa;
  local_150.ptr_ = local_130;
  fmt::v8::format_system_error(&local_150,last_errno,(msg->_M_dataplus)._M_p);
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_170,local_150.ptr_,local_150.ptr_ + local_150.size_);
  std::__cxx11::string::operator=((string *)&this->msg_,(string *)local_170);
  if (local_170[0] != local_160) {
    operator_delete(local_170[0]);
  }
  if (local_150.ptr_ != local_130) {
    operator_delete(local_150.ptr_);
  }
  return;
}

Assistant:

SPDLOG_INLINE spdlog_ex::spdlog_ex(const std::string &msg, int last_errno)
{
    memory_buf_t outbuf;
    fmt::format_system_error(outbuf, last_errno, msg.c_str());
    msg_ = fmt::to_string(outbuf);
}